

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

error_code
anon_unknown.dwarf_73da7a::validate_section_ifixups<pstore::repo::generic_section>
          (fragment *f,generic_section *s)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  error e;
  long lVar5;
  byte *pbVar6;
  container<unsigned_char> cVar7;
  error_code eVar8;
  
  cVar7 = pstore::repo::generic_section::payload(s);
  pbVar4 = (byte *)((ulong)(cVar7.end_ + 7) & 0xfffffffffffffff8);
  uVar3 = (ulong)((s->field_0).field32_ >> 5 & 0xfffffff8) * 3;
  pbVar1 = pbVar4 + uVar3;
  lVar5 = (long)((uVar3 >> 3) * -0x5555555555555555) >> 2;
  pbVar6 = pbVar4;
  if (0 < lVar5) {
    uVar2 = (f->arr_).sa_.bitmap_;
    pbVar6 = pbVar4 + lVar5 * 0x60;
    lVar5 = lVar5 + 1;
    pbVar4 = pbVar4 + 0x30;
    do {
      if ((0x1f < pbVar4[-0x30]) || ((1 << (pbVar4[-0x30] & 0x1f) & uVar2) == 0)) {
        pbVar4 = pbVar4 + -0x30;
        goto LAB_001c66d0;
      }
      if ((0x1f < pbVar4[-0x18]) || ((1 << (pbVar4[-0x18] & 0x1f) & uVar2) == 0)) {
        pbVar4 = pbVar4 + -0x18;
        goto LAB_001c66d0;
      }
      if ((0x1f < *pbVar4) || ((1 << (*pbVar4 & 0x1f) & uVar2) == 0)) goto LAB_001c66d0;
      if ((0x1f < pbVar4[0x18]) || ((1 << (pbVar4[0x18] & 0x1f) & uVar2) == 0)) {
        pbVar4 = pbVar4 + 0x18;
        goto LAB_001c66d0;
      }
      lVar5 = lVar5 + -1;
      pbVar4 = pbVar4 + 0x60;
    } while (1 < lVar5);
  }
  lVar5 = ((long)pbVar1 - (long)pbVar6 >> 3) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar4 = pbVar1;
      if (((lVar5 != 3) || (pbVar4 = pbVar6, 0x1f < *pbVar6)) ||
         ((1 << (*pbVar6 & 0x1f) & (f->arr_).sa_.bitmap_) == 0)) goto LAB_001c66d0;
      pbVar6 = pbVar6 + 0x18;
    }
    pbVar4 = pbVar6;
    if ((0x1f < *pbVar6) || ((1 << (*pbVar6 & 0x1f) & (f->arr_).sa_.bitmap_) == 0))
    goto LAB_001c66d0;
    pbVar6 = pbVar6 + 0x18;
  }
  pbVar4 = pbVar6;
  if ((*pbVar6 < 0x20) && ((1 << (*pbVar6 & 0x1f) & (f->arr_).sa_.bitmap_) != 0)) {
    pbVar4 = pbVar1;
  }
LAB_001c66d0:
  e = internal_fixup_target_not_found;
  if (pbVar4 == pbVar1) {
    e = none;
  }
  eVar8 = pstore::exchange::import_ns::make_error_code(e);
  return eVar8;
}

Assistant:

std::error_code validate_section_ifixups (pstore::repo::fragment const & f, Section const & s) {
        using pstore::exchange::import_ns::error;

        auto const container = s.ifixups ();
        return std::any_of (std::begin (container), std::end (container),
                            [&] (pstore::repo::internal_fixup const & ifx) {
                                return !f.has_section (ifx.section);
                            })
                   ? error::internal_fixup_target_not_found
                   : error::none;
    }